

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall wasm_tabletype_t::wasm_tabletype_t(wasm_tabletype_t *this,TableType *tt)

{
  ExternType *local_20;
  
  std::make_unique<wabt::interp::TableType,wabt::interp::TableType&>
            ((TableType *)&stack0xffffffffffffffe0);
  (this->super_wasm_externtype_t).I._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl = local_20;
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_externtype_t_0024ec68;
  (this->elemtype).I = *(ValueType *)&(tt->super_ExternType).field_0xc;
  this->limits = (wasm_limits_t)((tt->limits).max << 0x20 | (ulong)(uint)(tt->limits).initial);
  return;
}

Assistant:

wasm_tabletype_t(TableType tt)
      : wasm_externtype_t{std::make_unique<TableType>(tt)},
        elemtype{tt.element},
        limits{FromWabtLimits(tt.limits)} {}